

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

void __thiscall Transcript::AddSequence(Transcript *this,string *seq)

{
  length_error *this_00;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (seq->_M_string_length ==
      (long)(((this->super_Polymer).stop_ - (this->super_Polymer).start_) + 1)) {
    std::__cxx11::string::_M_assign((string *)&(this->super_Polymer).polymerases_.seq_);
    std::__cxx11::string::_M_assign((string *)&this->seq_);
    return;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_a0,seq->_M_string_length);
  std::operator+(&local_80,"Provided sequence is not the correct size. ",&local_a0);
  std::operator+(&local_60,&local_80," ");
  std::__cxx11::to_string
            (&local_c0,((this->super_Polymer).stop_ - (this->super_Polymer).start_) + 1);
  std::operator+(&local_40,&local_60,&local_c0);
  std::length_error::length_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

void Transcript::AddSequence(const std::string &seq) {
  if (seq.size() != (stop_ - start_ + 1)) { //start_ should always be 1
    throw std::length_error("Provided sequence is not the correct size. " +
                            std::to_string(seq.size()) + " " +
                            std::to_string(stop_ - start_ + 1));
  }
  polymerases_.set_sequence(seq);
  seq_ = seq;
}